

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

bool __thiscall SymbolTable::isTempName(SymbolTable *this,string *name,string *curFun)

{
  pointer pvVar1;
  pointer pSVar2;
  size_t __n;
  int iVar3;
  mapped_type *pmVar4;
  pointer pSVar5;
  
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->funToName,curFun);
  pvVar1 = (this->symbolTable).
           super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar5 = pvVar1[*pmVar4].
           super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = *(pointer *)
            ((long)&pvVar1[*pmVar4].
                    super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (pSVar5 != pSVar2) {
    __n = name->_M_string_length;
    do {
      if (((pSVar5->name)._M_string_length == __n) &&
         (((__n == 0 ||
           (iVar3 = bcmp((pSVar5->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n), iVar3 == 0))
          && (pSVar5->isTemp != false)))) {
        return true;
      }
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar2);
  }
  return false;
}

Assistant:

bool SymbolTable::isTempName(string name, string curFun) {
    int index = funToName[curFun];
    for (auto &i : symbolTable[index]) {
        if(i.name == name && i.isTemp) {
            return true;
        }
    }
//    cout << "未找到该变量" << endl;
    return false;
}